

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFalse.c
# Opt level: O2

void Gia_ManFalseRebuildOne
               (Gia_Man_t *pNew,Gia_Man_t *p,Vec_Int_t *vHook,int fVerbose,int fVeryVerbose)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iLit1;
  uint uVar4;
  uint uVar5;
  Gia_Obj_t *pGVar6;
  Gia_Obj_t *pGVar7;
  char *__assertion;
  uint local_50;
  
  iVar2 = Vec_IntEntry(vHook,0);
  pGVar6 = Gia_ManObj(p,iVar2);
  if (vHook->nSize == 1) {
    pGVar6->Value = 0;
    return;
  }
  if (vHook->nSize < 2) {
    __assertion = "Vec_IntSize(vHook) >= 2";
    uVar5 = 0x3a;
  }
  else {
    iVar2 = Vec_IntEntry(vHook,1);
    pGVar7 = Gia_ManObj(p,iVar2);
    uVar5 = (uint)*(undefined8 *)pGVar7;
    if ((pGVar7 + -(ulong)(uVar5 & 0x1fffffff) == pGVar6) ||
       (uVar5 = (uint)((ulong)*(undefined8 *)pGVar7 >> 0x20),
       pGVar7 + -(ulong)(uVar5 & 0x1fffffff) == pGVar6)) {
      pGVar6 = (Gia_Obj_t *)0x0;
      local_50 = 0xffffffff;
      for (iVar2 = 0; iVar2 < vHook->nSize; iVar2 = iVar2 + 1) {
        iVar3 = Vec_IntEntry(vHook,iVar2);
        pGVar7 = Gia_ManObj(p,iVar3);
        if (pGVar7 == (Gia_Obj_t *)0x0) break;
        uVar1 = pGVar7->Value;
        uVar4 = uVar5 >> 0x1d & 1;
        if (iVar2 != 0) {
          iVar3 = Gia_ObjFanin0Copy(pGVar7);
          iLit1 = Gia_ObjFanin1Copy(pGVar7);
          uVar4 = Gia_ManHashAnd(pNew,iVar3,iLit1);
        }
        pGVar7->Value = uVar4;
        if (pGVar6 != (Gia_Obj_t *)0x0) {
          pGVar6->Value = local_50;
        }
        pGVar6 = pGVar7;
        local_50 = uVar1;
      }
      if (fVeryVerbose == 0) {
        return;
      }
      printf("Eliminated path: ");
      printf("Vector has %d entries: {",(ulong)(uint)vHook->nSize);
      for (iVar2 = 0; iVar2 < vHook->nSize; iVar2 = iVar2 + 1) {
        uVar5 = Vec_IntEntry(vHook,iVar2);
        printf(" %d",(ulong)uVar5);
      }
      puts(" }");
      iVar2 = 0;
      while( true ) {
        if (vHook->nSize <= iVar2) {
          return;
        }
        iVar3 = Vec_IntEntry(vHook,iVar2);
        pGVar6 = Gia_ManObj(p,iVar3);
        if (pGVar6 == (Gia_Obj_t *)0x0) break;
        uVar5 = Gia_ObjLevel(p,pGVar6);
        printf("Level %3d : ",(ulong)uVar5);
        Gia_ObjPrint(p,pGVar6);
        iVar2 = iVar2 + 1;
      }
      return;
    }
    __assertion = "0";
    uVar5 = 0x41;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaFalse.c"
                ,uVar5,
                "void Gia_ManFalseRebuildOne(Gia_Man_t *, Gia_Man_t *, Vec_Int_t *, int, int)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Reconstruct the AIG after detecting false paths.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Gia_ManFalseRebuildOne( Gia_Man_t * pNew, Gia_Man_t * p, Vec_Int_t * vHook, int fVerbose, int fVeryVerbose )
{
    Gia_Obj_t * pObj, * pObj1, * pPrev = NULL;
    int i, CtrlValue = 0, iPrevValue = -1;
    pObj = Gia_ManObj( p, Vec_IntEntry(vHook, 0) );
    if ( Vec_IntSize(vHook) == 1 )
    {
        pObj->Value = 0; // what if stuck at 1???
        return;
    }
    assert( Vec_IntSize(vHook) >= 2 );
    // find controlling value
    pObj1 = Gia_ManObj( p, Vec_IntEntry(vHook, 1) );
    if ( Gia_ObjFanin0(pObj1) == pObj )
        CtrlValue = Gia_ObjFaninC0(pObj1);
    else if ( Gia_ObjFanin1(pObj1) == pObj )
        CtrlValue = Gia_ObjFaninC1(pObj1);
    else assert( 0 );
//    printf( "%d ", CtrlValue );
    // rewrite the path
    Gia_ManForEachObjVec( vHook, p, pObj, i )
    {
        int iObjValue = pObj->Value;
        pObj->Value = i ? Gia_ManHashAnd(pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj)) : CtrlValue;
        if ( pPrev )
            pPrev->Value = iPrevValue;
        iPrevValue = iObjValue;
        pPrev = pObj;
    }
    if ( fVeryVerbose )
    {
        printf( "Eliminated path: " );
        Vec_IntPrint( vHook );
        Gia_ManForEachObjVec( vHook, p, pObj, i )
        {
            printf( "Level %3d : ", Gia_ObjLevel(p, pObj) );
            Gia_ObjPrint( p, pObj );
        }
    }
}